

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O2

bool __thiscall pg::MSPMSolver::lift(MSPMSolver *this,int node,int target)

{
  int *pm;
  uint uVar1;
  int *piVar2;
  Game *pGVar3;
  int *b;
  bool bVar4;
  int i;
  int pl;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  uint uVar8;
  char *pcVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint *puVar13;
  uint local_5c;
  uint local_54;
  
  lVar12 = (long)node;
  pm = this->pms + this->k * lVar12;
  if ((*pm != -1) || (pm[1] != -1)) {
    this->lift_attempt = this->lift_attempt + 1;
    pl = Solver::owner(&this->super_Solver,node);
    iVar6 = ((this->super_Solver).game)->_priority[lVar12];
    if (1 < (this->super_Solver).trace) {
      poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[1mupdating node ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,node);
      poVar7 = std::operator<<(poVar7,"/");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
      iVar5 = Solver::owner(&this->super_Solver,node);
      pcVar9 = " (odd)";
      if (iVar5 == 0) {
        pcVar9 = " (even)";
      }
      poVar7 = std::operator<<(poVar7,pcVar9);
      std::operator<<(poVar7,"\x1b[m with current progress measure");
      pm_stream(this,(this->super_Solver).logger,pm);
      std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
    }
    iVar5 = 1 - pl;
    local_54 = 0xffffffff;
    if (pm[pl] == -1) {
      local_5c = 0xffffffff;
    }
    else {
      if (1 < (this->super_Solver).trace) {
        poVar7 = std::operator<<((this->super_Solver).logger,"computing max");
        std::endl<char,std::char_traits<char>>(poVar7);
        if (1 < (this->super_Solver).trace) {
          pm_copy(this,this->tmp,pm,iVar5);
        }
      }
      if (target == -1) {
        pGVar3 = (this->super_Solver).game;
        puVar13 = (uint *)(pGVar3->_outedges + pGVar3->_firstouts[lVar12]);
        local_5c = 0xffffffff;
        local_54 = local_5c;
        while( true ) {
          uVar10 = *puVar13;
          lVar11 = (long)(int)uVar10;
          if (lVar11 == -1) break;
          uVar8 = local_54;
          if (this->cover[lVar11] != -2) {
            Prog(this,this->tmp,this->pms + this->k * lVar11,iVar6,pl);
            if (1 < (this->super_Solver).trace) {
              poVar7 = std::operator<<((this->super_Solver).logger,"successor node ");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar10);
              poVar7 = std::operator<<(poVar7,"/");
              poVar7 = (ostream *)
                       std::ostream::operator<<
                                 (poVar7,((this->super_Solver).game)->_priority[lVar11]);
              std::operator<<(poVar7," results in");
              pm_stream(this,(this->super_Solver).logger,this->tmp);
              std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
            }
            piVar2 = this->tmp;
            bVar4 = pm_less(this,pm,piVar2,iVar6,pl);
            if ((bVar4) && (pm_copy(this,pm,piVar2,pl), uVar8 = uVar10, pl == 0)) {
              local_5c = uVar10;
              uVar8 = local_54;
            }
          }
          local_54 = uVar8;
          puVar13 = puVar13 + 1;
        }
      }
      else {
        Prog(this,this->tmp,this->pms + (long)this->k * (long)target,iVar6,pl);
        if (1 < (this->super_Solver).trace) {
          poVar7 = std::operator<<((this->super_Solver).logger,"successor node ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,target);
          poVar7 = std::operator<<(poVar7,"/");
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,((this->super_Solver).game)->_priority[target]);
          std::operator<<(poVar7," results in");
          pm_stream(this,(this->super_Solver).logger,this->tmp);
          std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
        }
        piVar2 = this->tmp;
        bVar4 = pm_less(this,pm,piVar2,iVar6,pl);
        local_5c = local_54;
        if (bVar4) {
          pm_copy(this,pm,piVar2,pl);
          local_54 = -(uint)(pl == 0) | target;
          local_5c = -(uint)(pl != 0) | target;
        }
      }
    }
    uVar10 = local_54;
    if ((pm[iVar5] != -1) && ((target == -1 || (this->strategy[lVar12] == target)))) {
      if (1 < (this->super_Solver).trace) {
        poVar7 = std::operator<<((this->super_Solver).logger,"computing min");
        std::endl<char,std::char_traits<char>>(poVar7);
        if (1 < (this->super_Solver).trace) {
          pm_copy(this,this->tmp,pm,pl);
        }
      }
      pGVar3 = (this->super_Solver).game;
      puVar13 = (uint *)(pGVar3->_outedges + pGVar3->_firstouts[lVar12]);
      uVar8 = 0xffffffff;
      while( true ) {
        uVar1 = *puVar13;
        lVar11 = (long)(int)uVar1;
        if (lVar11 == -1) break;
        if (this->cover[lVar11] != -2) {
          Prog(this,this->tmp,this->pms + this->k * lVar11,iVar6,iVar5);
          if (1 < (this->super_Solver).trace) {
            poVar7 = std::operator<<((this->super_Solver).logger,"successor node ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar1);
            poVar7 = std::operator<<(poVar7,"/");
            poVar7 = (ostream *)
                     std::ostream::operator<<(poVar7,((this->super_Solver).game)->_priority[lVar11])
            ;
            std::operator<<(poVar7," results in");
            pm_stream(this,(this->super_Solver).logger,this->tmp);
            std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
          }
          piVar2 = this->tmp;
          b = this->best;
          if ((uVar8 == 0xffffffff) || (bVar4 = pm_less(this,piVar2,b,iVar6,iVar5), bVar4)) {
            for (lVar11 = 0; uVar8 = uVar1, lVar11 < this->k; lVar11 = lVar11 + 1) {
              b[lVar11] = piVar2[lVar11];
            }
          }
        }
        puVar13 = puVar13 + 1;
      }
      this->strategy[lVar12] = uVar8;
      piVar2 = this->best;
      bVar4 = pm_less(this,pm,piVar2,iVar6,iVar5);
      if ((bVar4) && (pm_copy(this,pm,piVar2,iVar5), uVar10 = uVar8, pl == 1)) {
        uVar10 = local_54;
        local_5c = uVar8;
      }
    }
    if ((local_5c != 0xffffffff) || (uVar10 != 0xffffffff)) {
      if ((this->super_Solver).trace != 0) {
        poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[1;32mupdated node ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,node);
        poVar7 = std::operator<<(poVar7,"/");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
        iVar6 = Solver::owner(&this->super_Solver,node);
        pcVar9 = " (odd)";
        if (iVar6 == 0) {
          pcVar9 = " (even)";
        }
        poVar7 = std::operator<<(poVar7,pcVar9);
        std::operator<<(poVar7,"\x1b[m to");
        pm_stream(this,(this->super_Solver).logger,pm);
        std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
      }
      if ((local_5c != 0xffffffff) && (*pm == -1)) {
        solve(this,node,local_5c);
      }
      if ((uVar10 != 0xffffffff) && (pm[1] == -1)) {
        solve(this,node,uVar10);
      }
      this->lift_count = this->lift_count + 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool
MSPMSolver::lift(int node, int target)
{
    // obtain ptr to current progress measure
    int *pm = pms + k*node;

    // check if already Top for both players
    if (pm[0] == -1 and pm[1] == -1) return false;

    lift_attempt++;

    // initialize stuff
    const int pl_max = owner(node);
    const int pl_min = 1 - pl_max;
    const int d = priority(node);

    if (trace >= 2) {
        logger << "\033[1mupdating node " << node << "/" << d << (owner(node)?" (odd)":" (even)") << "\033[m with current progress measure";
        pm_stream(logger, pm);
        logger << std::endl;
    }

    int best_ch0 = -1, best_ch1 = -1;

    // do max for player <pl_max>
    if (pm[pl_max] != -1) {
        if (trace >= 2) logger << "computing max" << std::endl;
        if (trace >= 2) pm_copy(tmp, pm, 1-pl_max);

        if (target != -1) {
            // just look at target
            Prog(tmp, pms + k*target, d, pl_max);

            if (trace >= 2) {
                logger << "successor node " << target << "/" << priority(target) << " results in";
                pm_stream(logger, tmp);
                logger << std::endl;
            }

            if (pm_less(pm, tmp, d, pl_max)) {
                pm_copy(pm, tmp, pl_max);
                if (pl_max) best_ch1 = target;
                else best_ch0 = target;
            }
        } else {
            for (auto curedge = outs(node); *curedge != -1; curedge++) {
                int to = *curedge;
                if (cover[to] == -2) continue;
                Prog(tmp, pms + k*to, d, pl_max);

                if (trace >= 2) {
                    logger << "successor node " << to << "/" << priority(to) << " results in";
                    pm_stream(logger, tmp);
                    logger << std::endl;
                }

                if (pm_less(pm, tmp, d, pl_max)) {
                    pm_copy(pm, tmp, pl_max);
                    if (pl_max) best_ch1 = to;
                    else best_ch0 = to;
                }
            }
        }
    }

    // do min for player <pl_min>
    if (pm[pl_min] != -1 and (target == -1 or target == strategy[node])) {
        if (trace >= 2) logger << "computing min" << std::endl;
        if (trace >= 2) pm_copy(tmp, pm, 1-pl_min);
        int best_to = -1;
        for (auto curedge = outs(node); *curedge != -1; curedge++) {
            int to = *curedge;
            if (cover[to] == -2) continue;
            Prog(tmp, pms + k*to, d, pl_min);

            if (trace >= 2) {
                logger << "successor node " << to << "/" << priority(to) << " results in";
                pm_stream(logger, tmp);
                logger << std::endl;
            }

            if (best_to == -1 or pm_less(tmp, best, d, pl_min)) {
                for (int i=0; i<k; i++) best[i] = tmp[i];
                best_to = to;
            }
        }

        strategy[node] = best_to;
        // note: sometimes only the strategy changes, but the lowest pm stays the same
        // now "best" contains the smallest Prog, which may be higher than the current min
        if (pm_less(pm, best, d, pl_min)) {
            pm_copy(pm, best, pl_min);
            if (pl_min) best_ch1 = best_to;
            else best_ch0 = best_to;
        }
    }

    bool ch0 = best_ch0 != -1;
    bool ch1 = best_ch1 != -1;

    if (ch0 or ch1) {
        if (trace) {
            logger << "\033[1;32mupdated node " << node << "/" << d << (owner(node)?" (odd)":" (even)") << "\033[m to";
            pm_stream(logger, pm);
            logger << std::endl;
        }
        // check if a changed pm is now Top
        if (ch0 and pm[0] == -1) solve(node, best_ch0);
        if (ch1 and pm[1] == -1) solve(node, best_ch1);
        // increase count and return true
        lift_count++;
        return true;
    } else {
        return false;
    }
}